

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O0

BigUnsigned<84> *
absl::lts_20250127::strings_internal::BigUnsigned<84>::FiveToTheNth
          (BigUnsigned<84> *__return_storage_ptr__,int n)

{
  int iVar1;
  int *piVar2;
  uint32_t *puVar3;
  int local_18;
  int local_14;
  byte local_d;
  int big_power;
  bool first_pass;
  int n_local;
  
  big_power = n;
  BigUnsigned(__return_storage_ptr__,1);
  local_d = 1;
  for (; 0x1a < big_power; big_power = big_power + local_14 * -0x1b) {
    local_18 = big_power / 0x1b;
    piVar2 = std::min<int>(&local_18,
                           &strings_internal::(anonymous_namespace)::kLargestPowerOfFiveIndex);
    local_14 = *piVar2;
    if ((local_d & 1) == 0) {
      iVar1 = strings_internal::anon_unknown_0::LargePowerOfFiveSize(local_14);
      puVar3 = strings_internal::anon_unknown_0::LargePowerOfFiveData(local_14);
      MultiplyBy(__return_storage_ptr__,iVar1,puVar3);
    }
    else {
      puVar3 = strings_internal::anon_unknown_0::LargePowerOfFiveData(local_14);
      iVar1 = strings_internal::anon_unknown_0::LargePowerOfFiveSize(local_14);
      std::copy_n<unsigned_int_const*,int,unsigned_int*>
                (puVar3,iVar1,__return_storage_ptr__->words_);
      iVar1 = strings_internal::anon_unknown_0::LargePowerOfFiveSize(local_14);
      __return_storage_ptr__->size_ = iVar1;
      local_d = 0;
    }
  }
  MultiplyByFiveToTheNth(__return_storage_ptr__,big_power);
  return __return_storage_ptr__;
}

Assistant:

BigUnsigned<max_words> BigUnsigned<max_words>::FiveToTheNth(
    int n) {
  BigUnsigned answer(1u);

  // Seed from the table of large powers, if possible.
  bool first_pass = true;
  while (n >= kLargePowerOfFiveStep) {
    int big_power =
        std::min(n / kLargePowerOfFiveStep, kLargestPowerOfFiveIndex);
    if (first_pass) {
      // just copy, rather than multiplying by 1
      std::copy_n(LargePowerOfFiveData(big_power),
                  LargePowerOfFiveSize(big_power), answer.words_);
      answer.size_ = LargePowerOfFiveSize(big_power);
      first_pass = false;
    } else {
      answer.MultiplyBy(LargePowerOfFiveSize(big_power),
                        LargePowerOfFiveData(big_power));
    }
    n -= kLargePowerOfFiveStep * big_power;
  }
  answer.MultiplyByFiveToTheNth(n);
  return answer;
}